

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcacheoptimizer.cpp
# Opt level: O2

void meshopt::buildTriangleAdjacency
               (TriangleAdjacency *adjacency,uint *indices,size_t index_count,size_t vertex_count,
               meshopt_Allocator *allocator)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  size_t i;
  size_t sVar8;
  uint *puVar9;
  
  puVar4 = meshopt_Allocator::allocate<unsigned_int>(allocator,vertex_count);
  adjacency->counts = puVar4;
  puVar4 = meshopt_Allocator::allocate<unsigned_int>(allocator,vertex_count);
  adjacency->offsets = puVar4;
  puVar4 = meshopt_Allocator::allocate<unsigned_int>(allocator,index_count);
  adjacency->data = puVar4;
  memset(adjacency->counts,0,vertex_count * 4);
  puVar4 = adjacency->counts;
  for (sVar8 = 0; index_count != sVar8; sVar8 = sVar8 + 1) {
    puVar4[indices[sVar8]] = puVar4[indices[sVar8]] + 1;
  }
  puVar4 = adjacency->counts;
  puVar3 = adjacency->offsets;
  uVar7 = 0;
  for (sVar8 = 0; vertex_count != sVar8; sVar8 = sVar8 + 1) {
    puVar3[sVar8] = uVar7;
    uVar7 = uVar7 + puVar4[sVar8];
  }
  puVar4 = adjacency->offsets;
  puVar3 = adjacency->data;
  puVar9 = indices + 2;
  for (uVar6 = 0; index_count / 3 != uVar6; uVar6 = uVar6 + 1) {
    uVar7 = puVar9[-1];
    uVar1 = *puVar9;
    uVar2 = puVar4[puVar9[-2]];
    puVar4[puVar9[-2]] = uVar2 + 1;
    uVar5 = (uint)uVar6;
    puVar3[uVar2] = uVar5;
    uVar2 = puVar4[uVar7];
    puVar4[uVar7] = uVar2 + 1;
    puVar3[uVar2] = uVar5;
    uVar7 = puVar4[uVar1];
    puVar4[uVar1] = uVar7 + 1;
    puVar3[uVar7] = uVar5;
    puVar9 = puVar9 + 3;
  }
  puVar4 = adjacency->counts;
  puVar3 = adjacency->offsets;
  for (sVar8 = 0; vertex_count != sVar8; sVar8 = sVar8 + 1) {
    puVar3[sVar8] = puVar3[sVar8] - puVar4[sVar8];
  }
  return;
}

Assistant:

static void buildTriangleAdjacency(TriangleAdjacency& adjacency, const unsigned int* indices, size_t index_count, size_t vertex_count, meshopt_Allocator& allocator)
{
	size_t face_count = index_count / 3;

	// allocate arrays
	adjacency.counts = allocator.allocate<unsigned int>(vertex_count);
	adjacency.offsets = allocator.allocate<unsigned int>(vertex_count);
	adjacency.data = allocator.allocate<unsigned int>(index_count);

	// fill triangle counts
	memset(adjacency.counts, 0, vertex_count * sizeof(unsigned int));

	for (size_t i = 0; i < index_count; ++i)
	{
		assert(indices[i] < vertex_count);

		adjacency.counts[indices[i]]++;
	}

	// fill offset table
	unsigned int offset = 0;

	for (size_t i = 0; i < vertex_count; ++i)
	{
		adjacency.offsets[i] = offset;
		offset += adjacency.counts[i];
	}

	assert(offset == index_count);

	// fill triangle data
	for (size_t i = 0; i < face_count; ++i)
	{
		unsigned int a = indices[i * 3 + 0], b = indices[i * 3 + 1], c = indices[i * 3 + 2];

		adjacency.data[adjacency.offsets[a]++] = unsigned(i);
		adjacency.data[adjacency.offsets[b]++] = unsigned(i);
		adjacency.data[adjacency.offsets[c]++] = unsigned(i);
	}

	// fix offsets that have been disturbed by the previous pass
	for (size_t i = 0; i < vertex_count; ++i)
	{
		assert(adjacency.offsets[i] >= adjacency.counts[i]);

		adjacency.offsets[i] -= adjacency.counts[i];
	}
}